

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOfPlaceHolder
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QString *objectName)

{
  QDockAreaLayoutItem *pQVar1;
  QString *s1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 8;
  uVar4 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar4) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    pQVar1 = (this->item_list).d.ptr;
    if (*(long *)((long)&pQVar1->widgetItem + lVar3) == 0) {
      s1 = *(QString **)((long)&pQVar1->subinfo + lVar3);
      if ((s1 != (QString *)0x0) && (bVar2 = ::comparesEqual(s1,objectName), bVar2)) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (int *)0x0;
        (__return_storage_ptr__->d).size = 0;
        QList<int>::append(__return_storage_ptr__,(parameter_type)uVar4);
        return __return_storage_ptr__;
      }
    }
    else {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      indexOfPlaceHolder(__return_storage_ptr__,
                         *(QDockAreaLayoutInfo **)((long)&pQVar1->widgetItem + lVar3),objectName);
      if ((__return_storage_ptr__->d).size != 0) {
        QList<int>::prepend(__return_storage_ptr__,(parameter_type)uVar4);
        return __return_storage_ptr__;
      }
      QArrayDataPointer<int>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x28;
  } while( true );
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOfPlaceHolder(const QString &objectName) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOfPlaceHolder(objectName);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (item.placeHolderItem != nullptr && item.placeHolderItem->objectName == objectName) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}